

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_lax_indexed_indirect_Test::TestBody
          (CpuTest_lax_indexed_indirect_Test *this)

{
  ushort uVar1;
  undefined2 uVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar6;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar7;
  char *message;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_238;
  WithoutMatchers local_211;
  Matcher<unsigned_short> local_210;
  MockSpec<unsigned_char_(unsigned_short)> local_1f8;
  ReturnAction<int> local_1d8;
  Action<unsigned_char_(unsigned_short)> local_1c8;
  WithoutMatchers local_1a1;
  Matcher<unsigned_short> local_1a0;
  MockSpec<unsigned_char_(unsigned_short)> local_188;
  ReturnAction<int> local_168;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_lax_indexed_indirect_Test *local_10;
  CpuTest_lax_indexed_indirect_Test *this_local;
  
  (this->super_CpuTest).expected.pc = 0x4322;
  (this->super_CpuTest).registers.pc = 0x4322;
  (this->super_CpuTest).registers.x = 0xed;
  (this->super_CpuTest).expected.x = 'B';
  (this->super_CpuTest).expected.a = 'B';
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xa3);
  uVar1 = (this->super_CpuTest).expected.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    (this->super_CpuTest).expected.pc = uVar1 + 1;
    uVar2 = (this->super_CpuTest).registers.pc;
    testing::Matcher<unsigned_short>::Matcher(&local_48,uVar2 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_30,local_55,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x1f2,"mmu","read_byte(registers.pc + 1u)");
    testing::Return<int>((testing *)&local_88,0xab);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_78);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    testing::Matcher<unsigned_short>::Matcher(&local_c0,0xab);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_a8,&local_c1,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,499,"mmu","read_byte(0xAB)");
    testing::Return<int>((testing *)&local_f8,0x68);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_e8);
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
    testing::Matcher<unsigned_short>::~Matcher(&local_c0);
    bVar4 = n_e_s::core::test::u16_to_u8(0x198);
    testing::Matcher<unsigned_short>::Matcher(&local_130,(ushort)bVar4);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_118,&local_131,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,500,"mmu","read_byte(u16_to_u8(0xAB + 0xED))");
    testing::Return<int>((testing *)&local_168,0x34);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_158,(ReturnAction *)&local_168);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_158)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_168);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
    testing::Matcher<unsigned_short>::~Matcher(&local_130);
    bVar4 = n_e_s::core::test::u16_to_u8(0x199);
    testing::Matcher<unsigned_short>::Matcher(&local_1a0,(ushort)bVar4);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_188,&(this->super_CpuTest).mmu.super_MockMmu,&local_1a0);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_188,&local_1a1,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x1f5,"mmu","read_byte(u16_to_u8(0xAB + 0xED + 1u))");
    testing::Return<int>((testing *)&local_1d8,0x12);
    testing::internal::ReturnAction::operator_cast_to_Action(&local_1c8,(ReturnAction *)&local_1d8);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_1c8)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1c8);
    testing::internal::ReturnAction<int>::~ReturnAction(&local_1d8);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_188);
    testing::Matcher<unsigned_short>::~Matcher(&local_1a0);
    testing::Matcher<unsigned_short>::Matcher(&local_210,0x1234);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_1f8,&(this->super_CpuTest).mmu.super_MockMmu,&local_210);
    testing::internal::GetWithoutMatchers();
    pMVar6 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                       (&local_1f8,&local_211,(void *)0x0);
    pTVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                       (pMVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                        ,0x1f7,"mmu","read_byte(0x1234)");
    testing::Return<int>((testing *)&gtest_ar.message_,0x42);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_238,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar7,&local_238)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_238);
    testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_1f8);
    testing::Matcher<unsigned_short>::~Matcher(&local_210);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_258,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar5) {
      testing::Message::Message(&local_260);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                 ,0x1fa,message);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

TEST_F(CpuTest, lax_indexed_indirect) {
    registers.pc = expected.pc = 0x4322;
    registers.x = 0xED;
    expected.x = 0x42; // X is overwritten, so we can not use the test fixture
    expected.a = 0x42;
    stage_instruction(LAX_INXIND);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xAB));
    EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x68)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED))).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
            .WillOnce(Return(0x12));
    EXPECT_CALL(mmu, read_byte(0x1234)).WillOnce(Return(0x42));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}